

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,
                      xmlChar *value,unsigned_long length,xmlSchemaTypePtr type,
                      xmlSchemaFacetPtr facet,char *message,xmlChar *str1,xmlChar *str2)

{
  xmlSchemaWhitespaceValueType ws;
  int iVar1;
  xmlElementType *pxVar2;
  xmlChar *pxVar3;
  xmlChar *add;
  unsigned_long uVar4;
  xmlChar *pxVar5;
  xmlParserErrors code;
  xmlSchemaFacetPtr pxVar6;
  xmlSchemaTypeType type_00;
  char *pcVar7;
  xmlSchemaAbstractCtxtPtr ctxt;
  xmlSchemaTypePtr type_01;
  bool bVar8;
  char len [25];
  char actLen [25];
  xmlChar **str1_00;
  xmlChar **str2_00;
  xmlChar **str3;
  xmlChar *local_a8;
  xmlParserErrors local_9c;
  xmlSchemaAbstractCtxtPtr local_98;
  xmlNodePtr local_90;
  xmlChar **local_88;
  xmlChar *local_80;
  xmlChar *local_78 [4];
  xmlChar *local_58 [5];
  
  local_a8 = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    if ((actxt->type == 2) &&
       (pxVar2 = *(xmlElementType **)(actxt + 0xc), pxVar2 != (xmlElementType *)0x0))
    goto LAB_001a3605;
    bVar8 = false;
  }
  else {
    pxVar2 = &node->type;
LAB_001a3605:
    bVar8 = *pxVar2 == XML_ATTRIBUTE_NODE;
  }
  pxVar5 = (xmlChar *)length;
  local_98 = actxt;
  local_90 = node;
  local_88 = (xmlChar **)value;
  xmlSchemaFormatNodeForError(&local_a8,actxt,node);
  type_00 = XML_SCHEMA_FACET_ENUMERATION;
  if (error != XML_SCHEMAV_CVC_ENUMERATION_VALID) {
    type_00 = facet->type;
  }
  local_9c = error;
  local_a8 = xmlStrcat(local_a8,"[");
  pxVar3 = xmlStrcat(local_a8,(xmlChar *)"facet \'");
  local_a8 = pxVar3;
  add = xmlSchemaFacetTypeToString(type_00);
  local_a8 = xmlStrcat(pxVar3,add);
  local_a8 = xmlStrcat(local_a8,(xmlChar *)"\'] ");
  code = local_9c;
  if (type_00 - XML_SCHEMA_FACET_LENGTH < 3) {
    pcVar7 = "The value has a length of \'%s\'; ";
    if (bVar8) {
      pcVar7 = "The value \'%s\' has a length of \'%s\'; ";
    }
    local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
    uVar4 = xmlSchemaGetFacetValueAsULong(facet);
    str3 = local_78;
    snprintf((char *)str3,0x18,"%lu",uVar4);
    str2_00 = local_58;
    snprintf((char *)str2_00,0x18,"%lu",length);
    ctxt = local_98;
    if (type_00 == XML_SCHEMA_FACET_MINLENGTH) {
      pcVar7 = "this underruns the allowed minimum length of \'%s\'.\n";
LAB_001a3772:
      pxVar5 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
      ctxt = local_98;
    }
    else {
      if (type_00 == XML_SCHEMA_FACET_MAXLENGTH) {
        pcVar7 = "this exceeds the allowed maximum length of \'%s\'.\n";
        goto LAB_001a3772;
      }
      pxVar5 = xmlStrcat(local_a8,(xmlChar *)"this differs from the allowed length of \'%s\'.\n");
    }
    code = local_9c;
    str1_00 = local_88;
    local_a8 = pxVar5;
    if (!bVar8) {
      str1_00 = str2_00;
      str2_00 = str3;
      str3 = (xmlChar **)0x0;
    }
  }
  else {
    switch(type_00) {
    case XML_SCHEMA_FACET_MININCLUSIVE:
      pcVar7 = "The value \'%s\' is less than the minimum value allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_MINEXCLUSIVE:
      pcVar7 = "The value \'%s\' must be greater than \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_MAXINCLUSIVE:
      pcVar7 = "The value \'%s\' is greater than the maximum value allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
      pcVar7 = "The value \'%s\' must be less than \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_TOTALDIGITS:
      pcVar7 = "The value \'%s\' has more digits than are allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_FRACTIONDIGITS:
      pcVar7 = "The value \'%s\' has more fractional digits than are allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_PATTERN:
      pcVar7 = "The value \'%s\' is not accepted by the pattern \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_ENUMERATION:
      local_a8 = xmlStrcat(local_a8,(xmlChar *)
                                    "The value \'%s\' is not an element of the set {%s}.\n");
      local_78[0] = (xmlChar *)0x0;
      pxVar3 = (xmlChar *)0x0;
      local_80 = local_a8;
      do {
        type_01 = type->baseType;
        ws = xmlSchemaGetWhiteSpaceFacetValue(type_01);
        pxVar6 = type->facets;
        if (pxVar6 != (xmlSchemaFacetPtr)0x0) {
          bVar8 = false;
          do {
            if (pxVar6->type == XML_SCHEMA_FACET_ENUMERATION) {
              iVar1 = xmlSchemaGetCanonValueWhtspExt_1(pxVar6->val,ws,local_78,0);
              ctxt = local_98;
              if (iVar1 == -1) {
                xmlSchemaInternalErr2
                          (local_98,"xmlSchemaFormatFacetEnumSet",
                           "compute the canonical lexical representation",(xmlChar *)0x0,pxVar5);
                code = local_9c;
                if (pxVar3 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar3);
                }
                pxVar5 = local_80;
                str1_00 = local_88;
                str2_00 = (xmlChar **)0x0;
                str3 = (xmlChar **)0x0;
                goto LAB_001a395e;
              }
              if (pxVar3 == (xmlChar *)0x0) {
                pxVar3 = xmlStrdup("\'");
              }
              else {
                pxVar3 = xmlStrcat(pxVar3,(xmlChar *)", \'");
              }
              pxVar3 = xmlStrcat(pxVar3,local_78[0]);
              pxVar3 = xmlStrcat(pxVar3,"\'");
              bVar8 = true;
              if (local_78[0] != (xmlChar *)0x0) {
                (*xmlFree)(local_78[0]);
                local_78[0] = (xmlChar *)0x0;
              }
            }
            pxVar6 = pxVar6->next;
          } while (pxVar6 != (_xmlSchemaFacet *)0x0);
          if (bVar8) goto LAB_001a3a50;
          type_01 = type->baseType;
        }
        if ((type_01 == (xmlSchemaTypePtr)0x0) ||
           (type = type_01, type_01->type == XML_SCHEMA_TYPE_BASIC)) goto LAB_001a3a50;
      } while( true );
    default:
      if (bVar8) {
        local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value \'%s\' is not facet-valid.\n");
        str2_00 = (xmlChar **)0x0;
        str1_00 = local_88;
      }
      else {
        local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value is not facet-valid.\n");
        str2_00 = (xmlChar **)0x0;
        str1_00 = (xmlChar **)0x0;
      }
      goto LAB_001a3947;
    }
    local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
    str2_00 = (xmlChar **)facet->value;
    str1_00 = local_88;
LAB_001a3947:
    ctxt = local_98;
    pxVar5 = local_a8;
    str3 = (xmlChar **)0x0;
  }
LAB_001a395e:
  xmlSchemaErr4Line(ctxt,XML_ERR_ERROR,code,local_90,0,(char *)pxVar5,(xmlChar *)str1_00,
                    (xmlChar *)str2_00,(xmlChar *)str3,(xmlChar *)0x0);
LAB_001a3963:
  (*xmlFree)(local_a8);
  return;
LAB_001a3a50:
  xmlSchemaErr4Line(local_98,XML_ERR_ERROR,local_9c,local_90,0,(char *)local_80,(xmlChar *)local_88,
                    pxVar3,(xmlChar *)0x0,(xmlChar *)0x0);
  if (pxVar3 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar3);
  }
  goto LAB_001a3963;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,
		  xmlParserErrors error,
		  xmlNodePtr node,
		  const xmlChar *value,
		  unsigned long length,
		  xmlSchemaTypePtr type,
		  xmlSchemaFacetPtr facet,
		  const char *message,
		  const xmlChar *str1,
		  const xmlChar *str2)
{
    xmlChar *str = NULL, *msg = NULL;
    xmlSchemaTypeType facetType;
    int nodeType = xmlSchemaEvalErrorNodeType(actxt, node);

    xmlSchemaFormatNodeForError(&msg, actxt, node);
    if (error == XML_SCHEMAV_CVC_ENUMERATION_VALID) {
	facetType = XML_SCHEMA_FACET_ENUMERATION;
	/*
	* If enumerations are validated, one must not expect the
	* facet to be given.
	*/
    }